

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O1

void intgemm::kernel_write_test<(intgemm::CPUType)4,float>(void)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  AlignedVector<float> output;
  AlignedVector<float> input;
  AssertionHandler catchAssertionHandler;
  float local_ec;
  AlignedVector<float> local_e8;
  AlignedVector<float> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  long local_a8;
  char *local_a0;
  size_t sStack_98;
  float *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (3 < kCPU) {
    AlignedVector<float>::AlignedVector(&local_d8,0x10,0x40);
    AlignedVector<float>::AlignedVector(&local_e8,0x10,0x40);
    if (local_d8.size_ != 0) {
      fVar12 = 0.0;
      lVar10 = 0;
      do {
        *(float *)((long)local_d8.mem_ + lVar10) = fVar12;
        fVar12 = fVar12 + 1.0;
        lVar10 = lVar10 + 4;
      } while (local_d8.size_ << 2 != lVar10);
    }
    uVar3 = *(undefined8 *)(local_d8.mem_ + 2);
    uVar4 = *(undefined8 *)(local_d8.mem_ + 4);
    uVar5 = *(undefined8 *)(local_d8.mem_ + 6);
    uVar6 = *(undefined8 *)(local_d8.mem_ + 8);
    uVar7 = *(undefined8 *)(local_d8.mem_ + 10);
    uVar8 = *(undefined8 *)(local_d8.mem_ + 0xc);
    uVar9 = *(undefined8 *)(local_d8.mem_ + 0xe);
    *(undefined8 *)local_e8.mem_ = *(undefined8 *)local_d8.mem_;
    *(undefined8 *)(local_e8.mem_ + 2) = uVar3;
    *(undefined8 *)(local_e8.mem_ + 4) = uVar4;
    *(undefined8 *)(local_e8.mem_ + 6) = uVar5;
    *(undefined8 *)(local_e8.mem_ + 8) = uVar6;
    *(undefined8 *)(local_e8.mem_ + 10) = uVar7;
    *(undefined8 *)(local_e8.mem_ + 0xc) = uVar8;
    *(undefined8 *)(local_e8.mem_ + 0xe) = uVar9;
    lVar10 = 0;
    lVar11 = 0;
    do {
      local_b8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
      local_ec = (float)lVar11;
      bVar2 = local_ec == *(float *)((long)local_e8.mem_ + lVar10);
      lVar1 = (long)local_e8.mem_ + lVar10;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
      local_b8.m_result = bVar2;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_001ed7d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = &local_ec;
      local_a8 = lVar1;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 4;
    } while (lVar11 != 0x10);
    free(local_e8.mem_);
    free(local_d8.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}